

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

TimerId __thiscall sznet::net::EventLoop::runAfter(EventLoop *this,double delay,TimerCallback *cb)

{
  _Manager_type p_Var1;
  Timestamp TVar2;
  TimerId TVar3;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type local_20;
  
  TVar2 = Timestamp::now();
  TVar2 = addTime(TVar2,delay);
  local_28 = (_Manager_type)0x0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = cb->_M_invoker;
  p_Var1 = (cb->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_38._M_unused._0_8_ = (undefined8)*(undefined8 *)&(cb->super__Function_base)._M_functor;
    local_38._8_8_ = *(undefined8 *)((long)&(cb->super__Function_base)._M_functor + 8);
    (cb->super__Function_base)._M_manager = (_Manager_type)0x0;
    cb->_M_invoker = (_Invoker_type)0x0;
    local_28 = p_Var1;
  }
  TVar3 = runAt(this,TVar2,(TimerCallback *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return TVar3;
}

Assistant:

TimerId EventLoop::runAfter(double delay, TimerCallback cb)
{
	Timestamp time(addTime(Timestamp::now(), delay));
	return runAt(time, std::move(cb));
}